

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

void __thiscall
afsm::
priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::process_deferred_queue
          (priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this)

{
  mutex_type *__mutex;
  test_fsm_observer *ptVar1;
  pointer ppVar2;
  pthread_mutex_t *__mutex_00;
  int iVar3;
  event_process_result eVar4;
  undefined8 uVar5;
  _Any_data *p_Var6;
  _Any_data *p_Var7;
  bool bVar8;
  event_queue deferred;
  priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
  local_58;
  pthread_mutex_t *local_38;
  
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &this->deferred_mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
LAB_003732f5:
    uVar5 = std::__throw_system_error(iVar3);
    std::
    vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
    ::~vector(&local_58.c);
    _Unwind_Resume(uVar5);
  }
  p_Var7 = (_Any_data *)
           (this->deferred_events_).c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var6 = (_Any_data *)
           (this->deferred_events_).c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->deferred_events_).c.
       super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->deferred_events_).c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deferred_events_).c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deferred_events_).c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var7;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6;
  local_38 = (pthread_mutex_t *)__mutex;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (p_Var7 != p_Var6) {
    do {
      ptVar1 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
               super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (ptVar1 != (test_fsm_observer *)0x0) {
        test::test_fsm_observer::
        start_process_deferred_queue<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                  (ptVar1,this,((long)p_Var6 - (long)p_Var7 >> 3) * -0x3333333333333333);
        p_Var6 = (_Any_data *)
                 local_58.c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        p_Var7 = (_Any_data *)
                 local_58.c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      if (p_Var7 == p_Var6) {
        bVar8 = false;
      }
      else {
        do {
          if (*(long *)(p_Var7 + 1) == 0) {
            std::__throw_bad_function_call();
          }
          eVar4 = (**(code **)((long)p_Var7 + 0x18))(p_Var7);
          std::
          priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
          ::pop(&local_58);
          bVar8 = eVar4 == process;
        } while ((!bVar8) &&
                (p_Var7 = (_Any_data *)
                          local_58.c.
                          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                local_58.c.
                super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_58.c.
                super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish));
      }
      __mutex_00 = local_38;
      iVar3 = pthread_mutex_lock(local_38);
      if (iVar3 != 0) {
        iVar3 = std::__throw_system_error(iVar3);
        goto LAB_003732f5;
      }
      while (local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ::push_back(&(this->deferred_events_).c,
                    local_58.c.
                    super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        std::
        push_heap<__gnu_cxx::__normal_iterator<std::pair<std::function<afsm::actions::event_process_result()>,int>*,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
                  ((this->deferred_events_).c.
                   super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (this->deferred_events_).c.
                   super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::
        priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
        ::pop(&local_58);
      }
      pthread_mutex_unlock(__mutex_00);
      ptVar1 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
               super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (ptVar1 != (test_fsm_observer *)0x0) {
        test::test_fsm_observer::
        end_process_deferred_queue<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                  (ptVar1,this,
                   ((long)(this->deferred_events_).c.
                          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->deferred_events_).c.
                          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
      }
      if (bVar8) {
        p_Var7 = (_Any_data *)
                 (this->deferred_events_).c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var6 = (_Any_data *)
                 (this->deferred_events_).c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar2 = (this->deferred_events_).c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->deferred_events_).c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (this->deferred_events_).c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (this->deferred_events_).c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_58.c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var7;
        local_58.c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6;
        local_58.c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar2;
      }
      p_Var6 = (_Any_data *)
               local_58.c.
               super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      p_Var7 = (_Any_data *)
               local_58.c.
               super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ::~vector(&local_58.c);
  return;
}

Assistant:

void
    process_deferred_queue()
    {
        using actions::event_process_result;
        event_queue deferred;
        {
            lock_guard lock{deferred_mutex_};
            ::std::swap(deferred_events_, deferred);
        }
        while (!deferred.empty()) {
            observer_wrapper::start_process_deferred_queue(*this, deferred.size());
            auto res = event_process_result::refuse;
            while (!deferred.empty()) {
                res = deferred.top().first();
                deferred.pop();
                if (res == event_process_result::process)
                    break;
            }
            {
                lock_guard lock{deferred_mutex_};
                while (!deferred.empty()) {
                    deferred_events_.push(deferred.top());
                    deferred.pop();
                }
            }
            observer_wrapper::end_process_deferred_queue(*this, deferred_events_.size());
            if (res == event_process_result::process) {
                ::std::swap(deferred_events_, deferred);
            }
        }
    }